

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_radix_scatter.cpp
# Opt level: O3

void duckdb::TemplatedRadixScatter<int>
               (UnifiedVectorFormat *vdata,SelectionVector *sel,idx_t add_count,
               data_ptr_t *key_locations,bool desc,bool has_null,bool nulls_first,idx_t offset)

{
  uint uVar1;
  data_ptr_t pdVar2;
  sel_t *psVar3;
  unsigned_long *puVar4;
  data_ptr_t pdVar5;
  uint *puVar6;
  idx_t iVar7;
  undefined7 in_register_00000089;
  idx_t s;
  idx_t iVar8;
  ulong uVar9;
  long lVar10;
  
  pdVar2 = vdata->data;
  if ((int)CONCAT71(in_register_00000089,has_null) == 0) {
    if (add_count != 0) {
      iVar7 = 0;
      do {
        iVar8 = iVar7;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar8 = (idx_t)sel->sel_vector[iVar7];
        }
        psVar3 = vdata->sel->sel_vector;
        if (psVar3 != (sel_t *)0x0) {
          iVar8 = (idx_t)psVar3[iVar8];
        }
        puVar6 = (uint *)key_locations[iVar7];
        uVar1 = *(uint *)(pdVar2 + iVar8 * 4 + offset * 4);
        *puVar6 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
        *(data_t *)puVar6 = (char)(uVar1 >> 0x18) + 0x80;
        if (desc) {
          lVar10 = 0;
          do {
            key_locations[iVar7][lVar10] = ~key_locations[iVar7][lVar10];
            lVar10 = lVar10 + 1;
          } while (lVar10 != 4);
        }
        key_locations[iVar7] = key_locations[iVar7] + 4;
        iVar7 = iVar7 + 1;
      } while (iVar7 != add_count);
    }
  }
  else if (add_count != 0) {
    iVar7 = 0;
    do {
      iVar8 = iVar7;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar8 = (idx_t)sel->sel_vector[iVar7];
      }
      psVar3 = vdata->sel->sel_vector;
      if (psVar3 != (sel_t *)0x0) {
        iVar8 = (idx_t)psVar3[iVar8];
      }
      uVar9 = iVar8 + offset;
      puVar4 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar4 == (unsigned_long *)0x0) || ((puVar4[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) != 0)) {
        *key_locations[iVar7] = nulls_first;
        pdVar5 = key_locations[iVar7];
        uVar1 = *(uint *)(pdVar2 + uVar9 * 4);
        *(uint *)(pdVar5 + 1) =
             uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
        pdVar5[1] = (char)(uVar1 >> 0x18) + 0x80;
        if (desc) {
          lVar10 = 0;
          do {
            key_locations[iVar7][lVar10 + 1] = ~key_locations[iVar7][lVar10 + 1];
            lVar10 = lVar10 + 1;
          } while (lVar10 != 4);
        }
      }
      else {
        *key_locations[iVar7] = !nulls_first;
        pdVar5 = key_locations[iVar7];
        pdVar5[1] = '\0';
        pdVar5[2] = '\0';
        pdVar5[3] = '\0';
        pdVar5[4] = '\0';
      }
      key_locations[iVar7] = key_locations[iVar7] + 5;
      iVar7 = iVar7 + 1;
    } while (iVar7 != add_count);
  }
  return;
}

Assistant:

void TemplatedRadixScatter(UnifiedVectorFormat &vdata, const SelectionVector &sel, idx_t add_count,
                           data_ptr_t *key_locations, const bool desc, const bool has_null, const bool nulls_first,
                           const idx_t offset) {
	auto source = UnifiedVectorFormat::GetData<T>(vdata);
	if (has_null) {
		auto &validity = vdata.validity;
		const data_t valid = nulls_first ? 1 : 0;
		const data_t invalid = 1 - valid;

		for (idx_t i = 0; i < add_count; i++) {
			auto idx = sel.get_index(i);
			auto source_idx = vdata.sel->get_index(idx) + offset;
			// write validity and according value
			if (validity.RowIsValid(source_idx)) {
				key_locations[i][0] = valid;
				Radix::EncodeData<T>(key_locations[i] + 1, source[source_idx]);
				// invert bits if desc
				if (desc) {
					for (idx_t s = 1; s < sizeof(T) + 1; s++) {
						*(key_locations[i] + s) = ~*(key_locations[i] + s);
					}
				}
			} else {
				key_locations[i][0] = invalid;
				memset(key_locations[i] + 1, '\0', sizeof(T));
			}
			key_locations[i] += sizeof(T) + 1;
		}
	} else {
		for (idx_t i = 0; i < add_count; i++) {
			auto idx = sel.get_index(i);
			auto source_idx = vdata.sel->get_index(idx) + offset;
			// write value
			Radix::EncodeData<T>(key_locations[i], source[source_idx]);
			// invert bits if desc
			if (desc) {
				for (idx_t s = 0; s < sizeof(T); s++) {
					*(key_locations[i] + s) = ~*(key_locations[i] + s);
				}
			}
			key_locations[i] += sizeof(T);
		}
	}
}